

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

int __thiscall ncnn::Convolution::load_param(Convolution *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  Mat *in_RDI;
  float fVar2;
  int def;
  int def_00;
  Mat *this_00;
  int in_stack_ffffffffffffff64;
  ParamDict *in_stack_ffffffffffffff68;
  Mat local_90 [2];
  ParamDict *local_10;
  
  def_00 = 0;
  local_10 = in_RSI;
  iVar1 = ParamDict::get(in_RSI,0,0);
  *(int *)&in_RDI[2].cstep = iVar1;
  def = 1;
  iVar1 = ParamDict::get(local_10,1,def_00);
  *(int *)((long)&in_RDI[2].cstep + 4) = iVar1;
  iVar1 = ParamDict::get(local_10,0xb,*(int *)((long)&in_RDI[2].cstep + 4));
  *(int *)&in_RDI[3].data = iVar1;
  iVar1 = ParamDict::get(local_10,2,def);
  *(int *)((long)&in_RDI[3].data + 4) = iVar1;
  iVar1 = ParamDict::get(local_10,0xc,*(int *)((long)&in_RDI[3].data + 4));
  *(int *)&in_RDI[3].refcount = iVar1;
  iVar1 = ParamDict::get(local_10,3,def);
  *(int *)((long)&in_RDI[3].refcount + 4) = iVar1;
  iVar1 = ParamDict::get(local_10,0xd,*(int *)((long)&in_RDI[3].refcount + 4));
  *(int *)&in_RDI[3].elemsize = iVar1;
  iVar1 = ParamDict::get(local_10,4,def_00);
  *(int *)((long)&in_RDI[3].elemsize + 4) = iVar1;
  iVar1 = ParamDict::get(local_10,0xf,*(int *)((long)&in_RDI[3].elemsize + 4));
  in_RDI[3].elempack = iVar1;
  iVar1 = ParamDict::get(local_10,0xe,*(int *)((long)&in_RDI[3].elemsize + 4));
  *(int *)&in_RDI[3].field_0x1c = iVar1;
  iVar1 = ParamDict::get(local_10,0x10,*(int *)&in_RDI[3].field_0x1c);
  *(int *)&in_RDI[3].allocator = iVar1;
  fVar2 = ParamDict::get(local_10,0x12,0.0);
  *(float *)((long)&in_RDI[3].allocator + 4) = fVar2;
  iVar1 = ParamDict::get(local_10,5,def_00);
  in_RDI[3].dims = iVar1;
  iVar1 = ParamDict::get(local_10,6,def_00);
  in_RDI[3].w = iVar1;
  iVar1 = ParamDict::get(local_10,8,def_00);
  in_RDI[3].h = iVar1;
  iVar1 = ParamDict::get(local_10,9,def_00);
  in_RDI[3].c = iVar1;
  this_00 = local_90;
  ncnn::Mat::Mat(this_00);
  ParamDict::get(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,this_00);
  ncnn::Mat::operator=(in_RDI,(Mat *)CONCAT44(def_00,def));
  ncnn::Mat::~Mat((Mat *)0x1841bb);
  ncnn::Mat::~Mat((Mat *)0x1841c5);
  iVar1 = ParamDict::get(local_10,0x11,0);
  *(int *)((long)&in_RDI[8].data + 4) = iVar1;
  return 0;
}

Assistant:

int Convolution::load_param(const ParamDict& pd)
{
    num_output = pd.get(0, 0);
    kernel_w = pd.get(1, 0);
    kernel_h = pd.get(11, kernel_w);
    dilation_w = pd.get(2, 1);
    dilation_h = pd.get(12, dilation_w);
    stride_w = pd.get(3, 1);
    stride_h = pd.get(13, stride_w);
    pad_left = pd.get(4, 0);
    pad_right = pd.get(15, pad_left);
    pad_top = pd.get(14, pad_left);
    pad_bottom = pd.get(16, pad_top);
    pad_value = pd.get(18, 0.f);
    bias_term = pd.get(5, 0);
    weight_data_size = pd.get(6, 0);
    int8_scale_term = pd.get(8, 0);
    activation_type = pd.get(9, 0);
    activation_params = pd.get(10, Mat());
    impl_type = pd.get(17, 0);

    return 0;
}